

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O2

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption> *t)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  int iVar4;
  
  iVar1 = (t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar4 = iVar1;
    if (iVar4 < 1) break;
    pTVar3 = RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                       (&t->super_RepeatedPtrFieldBase,iVar4 + -1);
    bVar2 = AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>>
                      (&pTVar3->name_);
    iVar1 = iVar4 + -1;
  } while (bVar2);
  return iVar4 < 1;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0; ) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}